

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void iadst4x4_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  int32_t iVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  int iVar16;
  long lVar17;
  undefined1 auVar18 [16];
  long lVar19;
  int iVar20;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar21 [16];
  int iVar25;
  int iVar26;
  int iVar28;
  uint uVar29;
  int iVar30;
  undefined1 auVar27 [16];
  int iVar31;
  int iVar32;
  int iVar34;
  int iVar35;
  undefined1 auVar33 [16];
  int iVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  iVar16 = bit + -10;
  auVar18 = ZEXT416((uint)(1 << ((char)bit + 3U & 0x1f)));
  auVar18 = insertps(auVar18,auVar18,0x2a);
  iVar4 = av1_sinpi_arr_data[iVar16][1];
  auVar54._4_4_ = iVar4;
  auVar54._0_4_ = iVar4;
  auVar54._8_4_ = iVar4;
  auVar54._12_4_ = iVar4;
  iVar4 = av1_sinpi_arr_data[iVar16][2];
  auVar52._4_4_ = iVar4;
  auVar52._0_4_ = iVar4;
  auVar52._8_4_ = iVar4;
  auVar52._12_4_ = iVar4;
  iVar4 = av1_sinpi_arr_data[iVar16][3];
  auVar44._4_4_ = iVar4;
  auVar44._0_4_ = iVar4;
  auVar44._8_4_ = iVar4;
  auVar44._12_4_ = iVar4;
  iVar4 = av1_sinpi_arr_data[iVar16][4];
  auVar42._4_4_ = iVar4;
  auVar42._0_4_ = iVar4;
  auVar42._8_4_ = iVar4;
  auVar42._12_4_ = iVar4;
  alVar1 = *in;
  alVar2 = in[2];
  alVar3 = in[3];
  auVar55 = pmulld((undefined1  [16])alVar1,auVar54);
  auVar21 = pmulld((undefined1  [16])alVar1,auVar52);
  auVar33 = pmulld((undefined1  [16])in[1],auVar44);
  auVar56 = pmulld((undefined1  [16])alVar2,auVar42);
  auVar27 = pmulld(auVar52,(undefined1  [16])alVar3);
  iVar26 = auVar27._0_4_ + auVar56._0_4_ + auVar55._0_4_;
  iVar28 = auVar27._4_4_ + auVar56._4_4_ + auVar55._4_4_;
  iVar30 = auVar27._8_4_ + auVar56._8_4_ + auVar55._8_4_;
  iVar31 = auVar27._12_4_ + auVar56._12_4_ + auVar55._12_4_;
  auVar27._0_4_ = ((int)alVar1[0] - (int)alVar2[0]) + (int)alVar3[0];
  auVar27._4_4_ = (alVar1[0]._4_4_ - alVar2[0]._4_4_) + alVar3[0]._4_4_;
  auVar27._8_4_ = ((int)alVar1[1] - (int)alVar2[1]) + (int)alVar3[1];
  auVar27._12_4_ = (alVar1[1]._4_4_ - alVar2[1]._4_4_) + alVar3[1]._4_4_;
  auVar52 = pmulld((undefined1  [16])alVar2,auVar54);
  auVar55 = pmulld((undefined1  [16])alVar3,auVar42);
  iVar16 = auVar21._0_4_ - (auVar55._0_4_ + auVar52._0_4_);
  iVar22 = auVar21._4_4_ - (auVar55._4_4_ + auVar52._4_4_);
  iVar24 = auVar21._8_4_ - (auVar55._8_4_ + auVar52._8_4_);
  iVar25 = auVar21._12_4_ - (auVar55._12_4_ + auVar52._12_4_);
  auVar27 = pmulld(auVar27,auVar44);
  iVar32 = auVar33._0_4_;
  iVar34 = auVar33._4_4_;
  iVar35 = auVar33._8_4_;
  iVar36 = auVar33._12_4_;
  iVar20 = (iVar16 - iVar32) + iVar26;
  iVar23 = (iVar22 - iVar34) + iVar28;
  auVar21._0_8_ = CONCAT44(iVar23,iVar20);
  auVar21._8_4_ = (iVar24 - iVar35) + iVar30;
  auVar21._12_4_ = (iVar25 - iVar36) + iVar31;
  iVar26 = iVar26 + iVar32;
  iVar28 = iVar28 + iVar34;
  auVar37._0_8_ = CONCAT44(iVar28,iVar26);
  auVar37._8_4_ = iVar30 + iVar35;
  auVar37._12_4_ = iVar31 + iVar36;
  iVar16 = iVar16 + iVar32;
  iVar22 = iVar22 + iVar34;
  auVar47._0_8_ = CONCAT44(iVar22,iVar16);
  auVar47._8_4_ = iVar24 + iVar35;
  auVar47._12_4_ = iVar25 + iVar36;
  uVar29 = iVar26 >> 0x1c;
  auVar5._4_8_ = 0;
  auVar5._0_4_ = uVar29;
  auVar55._0_12_ = auVar5 << 0x20;
  auVar55._12_4_ = auVar37._8_4_ >> 0x1c;
  auVar43._0_8_ = (ulong)(auVar37._0_8_ << 0x20) >> 0x1c;
  auVar43._8_8_ = (ulong)(auVar37._8_8_ << 0x20) >> 0x1c;
  auVar44 = pblendw(auVar43,auVar55,0xcc);
  lVar17 = auVar18._0_8_;
  lVar19 = auVar18._8_8_;
  auVar18 = pblendw(auVar37,(undefined1  [16])0x0,0x33);
  auVar38._4_4_ = iVar28 >> 0x1c;
  auVar38._0_4_ = uVar29;
  auVar38._8_4_ = auVar55._12_4_;
  auVar38._12_4_ = auVar37._12_4_ >> 0x1c;
  auVar53._0_8_ = auVar18._0_8_ >> 0x1c;
  auVar53._8_8_ = auVar18._8_8_ >> 0x1c;
  auVar54 = pblendw(auVar53,auVar38,0xcc);
  uVar29 = iVar16 >> 0x1c;
  auVar6._4_8_ = 0;
  auVar6._0_4_ = uVar29;
  auVar45._0_12_ = auVar6 << 0x20;
  auVar45._12_4_ = auVar47._8_4_ >> 0x1c;
  auVar39._0_8_ = (ulong)(auVar47._0_8_ << 0x20) >> 0x1c;
  auVar39._8_8_ = (ulong)(auVar47._8_8_ << 0x20) >> 0x1c;
  auVar52 = pblendw(auVar39,auVar45,0xcc);
  auVar18 = pblendw(auVar47,(undefined1  [16])0x0,0x33);
  auVar50._4_4_ = iVar22 >> 0x1c;
  auVar50._0_4_ = uVar29;
  auVar50._8_4_ = auVar45._12_4_;
  auVar50._12_4_ = auVar47._12_4_ >> 0x1c;
  auVar46._0_8_ = auVar18._0_8_ >> 0x1c;
  auVar46._8_8_ = auVar18._8_8_ >> 0x1c;
  auVar47 = pblendw(auVar46,auVar50,0xcc);
  uVar29 = auVar27._0_4_ >> 0x1c;
  auVar7._4_8_ = 0;
  auVar7._0_4_ = uVar29;
  auVar48._0_12_ = auVar7 << 0x20;
  auVar48._12_4_ = auVar27._8_4_ >> 0x1c;
  auVar40._0_8_ = (ulong)(auVar27._0_8_ << 0x20) >> 0x1c;
  auVar40._8_8_ = (ulong)(auVar27._8_8_ << 0x20) >> 0x1c;
  auVar55 = pblendw(auVar40,auVar48,0xcc);
  auVar18 = pblendw(auVar27,(undefined1  [16])0x0,0x33);
  auVar33._4_4_ = auVar27._4_4_ >> 0x1c;
  auVar33._0_4_ = uVar29;
  auVar33._8_4_ = auVar48._12_4_;
  auVar33._12_4_ = auVar27._12_4_ >> 0x1c;
  auVar49._0_8_ = auVar18._0_8_ >> 0x1c;
  auVar49._8_8_ = auVar18._8_8_ >> 0x1c;
  auVar50 = pblendw(auVar49,auVar33,0xcc);
  uVar29 = iVar20 >> 0x1c;
  auVar8._4_8_ = 0;
  auVar8._0_4_ = uVar29;
  auVar51._0_12_ = auVar8 << 0x20;
  auVar51._12_4_ = auVar21._8_4_ >> 0x1c;
  auVar41._0_8_ = (ulong)(auVar21._0_8_ << 0x20) >> 0x1c;
  auVar41._8_8_ = (ulong)(auVar21._8_8_ << 0x20) >> 0x1c;
  auVar33 = pblendw(auVar41,auVar51,0xcc);
  auVar27 = pblendw((undefined1  [16])0x0,auVar21,0xcc);
  auVar18._4_4_ = iVar23 >> 0x1c;
  auVar18._0_4_ = uVar29;
  auVar18._8_4_ = auVar51._12_4_;
  auVar18._12_4_ = auVar21._12_4_ >> 0x1c;
  auVar56._0_8_ = auVar27._0_8_ >> 0x1c;
  auVar56._8_8_ = auVar27._8_8_ >> 0x1c;
  auVar18 = pblendw(auVar56,auVar18,0xcc);
  (*out)[0] = CONCAT44((int)((ulong)(auVar54._0_8_ + lVar17) >> 0x10),
                       (int)((ulong)(auVar44._0_8_ + lVar17) >> 0x10));
  (*out)[1] = CONCAT44((int)((ulong)(auVar54._8_8_ + lVar19) >> 0x10),
                       (int)((ulong)(auVar44._8_8_ + lVar19) >> 0x10));
  out[1][0] = CONCAT44((int)((ulong)(auVar47._0_8_ + lVar17) >> 0x10),
                       (int)((ulong)(auVar52._0_8_ + lVar17) >> 0x10));
  out[1][1] = CONCAT44((int)((ulong)(auVar47._8_8_ + lVar19) >> 0x10),
                       (int)((ulong)(auVar52._8_8_ + lVar19) >> 0x10));
  out[2][0] = CONCAT44((int)((ulong)(auVar50._0_8_ + lVar17) >> 0x10),
                       (int)((ulong)(auVar55._0_8_ + lVar17) >> 0x10));
  out[2][1] = CONCAT44((int)((ulong)(auVar50._8_8_ + lVar19) >> 0x10),
                       (int)((ulong)(auVar55._8_8_ + lVar19) >> 0x10));
  out[3][0] = CONCAT44((int)((ulong)(auVar18._0_8_ + lVar17) >> 0x10),
                       (int)((ulong)(auVar33._0_8_ + lVar17) >> 0x10));
  out[3][1] = CONCAT44((int)((ulong)(auVar18._8_8_ + lVar19) >> 0x10),
                       (int)((ulong)(auVar33._8_8_ + lVar19) >> 0x10));
  if (do_cols != 0) {
    return;
  }
  iVar16 = 10;
  if (10 < bd) {
    iVar16 = bd;
  }
  local_28 = 0x20 << ((byte)iVar16 & 0x1f);
  local_18 = -local_28;
  local_28 = local_28 + -1;
  if (out_shift != 0) {
    iVar30 = 1 << ((char)out_shift - 1U & 0x1f);
    iVar16 = *(int *)((long)*out + 4);
    lVar9 = (*out)[1];
    iVar20 = *(int *)((long)*out + 0xc);
    lVar10 = out[1][0];
    iVar22 = *(int *)((long)out[1] + 4);
    lVar11 = out[1][1];
    iVar23 = *(int *)((long)out[1] + 0xc);
    lVar12 = out[2][0];
    iVar24 = *(int *)((long)out[2] + 4);
    lVar13 = out[2][1];
    iVar25 = *(int *)((long)out[2] + 0xc);
    lVar14 = out[3][0];
    iVar26 = *(int *)((long)out[3] + 4);
    lVar15 = out[3][1];
    iVar28 = *(int *)((long)out[3] + 0xc);
    auVar18 = ZEXT416((uint)out_shift);
    *(int *)*out = (int)(*out)[0] + iVar30 >> auVar18;
    *(int *)((long)*out + 4) = iVar16 + iVar30 >> auVar18;
    *(int *)(*out + 1) = (int)lVar9 + iVar30 >> auVar18;
    *(int *)((long)*out + 0xc) = iVar20 + iVar30 >> auVar18;
    *(int *)out[1] = (int)lVar10 + iVar30 >> auVar18;
    *(int *)((long)out[1] + 4) = iVar22 + iVar30 >> auVar18;
    *(int *)(out[1] + 1) = (int)lVar11 + iVar30 >> auVar18;
    *(int *)((long)out[1] + 0xc) = iVar23 + iVar30 >> auVar18;
    *(int *)out[2] = (int)lVar12 + iVar30 >> auVar18;
    *(int *)((long)out[2] + 4) = iVar24 + iVar30 >> auVar18;
    *(int *)(out[2] + 1) = (int)lVar13 + iVar30 >> auVar18;
    *(int *)((long)out[2] + 0xc) = iVar25 + iVar30 >> auVar18;
    *(int *)out[3] = iVar30 + (int)lVar14 >> auVar18;
    *(int *)((long)out[3] + 4) = iVar30 + iVar26 >> auVar18;
    *(int *)(out[3] + 1) = iVar30 + (int)lVar15 >> auVar18;
    *(int *)((long)out[3] + 0xc) = iVar30 + iVar28 >> auVar18;
  }
  iStack_24 = local_28;
  iStack_20 = local_28;
  iStack_1c = local_28;
  iStack_14 = local_18;
  iStack_10 = local_18;
  iStack_c = local_18;
  highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_18,(__m128i *)&local_28,4);
  return;
}

Assistant:

static void iadst4x4_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                            int bd, int out_shift) {
  const int32_t *sinpi = sinpi_arr(bit);
  const __m128i zero = _mm_setzero_si128();
  __m128i rnding = _mm_set1_epi32(1 << (bit + 4 - 1));
  rnding = _mm_unpacklo_epi32(rnding, zero);
  const __m128i mul = _mm_set1_epi32(1 << 4);
  const __m128i sinpi1 = _mm_set1_epi32((int)sinpi[1]);
  const __m128i sinpi2 = _mm_set1_epi32((int)sinpi[2]);
  const __m128i sinpi3 = _mm_set1_epi32((int)sinpi[3]);
  const __m128i sinpi4 = _mm_set1_epi32((int)sinpi[4]);
  __m128i t;
  __m128i s0, s1, s2, s3, s4, s5, s6, s7;
  __m128i x0, x1, x2, x3;
  __m128i u0, u1, u2, u3;
  __m128i u0_low, u1_low, u2_low, u3_low;
  __m128i u0_high, u1_high, u2_high, u3_high;

  x0 = in[0];
  x1 = in[1];
  x2 = in[2];
  x3 = in[3];

  s0 = _mm_mullo_epi32(x0, sinpi1);
  s1 = _mm_mullo_epi32(x0, sinpi2);
  s2 = _mm_mullo_epi32(x1, sinpi3);
  s3 = _mm_mullo_epi32(x2, sinpi4);
  s4 = _mm_mullo_epi32(x2, sinpi1);
  s5 = _mm_mullo_epi32(x3, sinpi2);
  s6 = _mm_mullo_epi32(x3, sinpi4);
  t = _mm_sub_epi32(x0, x2);
  s7 = _mm_add_epi32(t, x3);

  t = _mm_add_epi32(s0, s3);
  s0 = _mm_add_epi32(t, s5);
  t = _mm_sub_epi32(s1, s4);
  s1 = _mm_sub_epi32(t, s6);
  s3 = s2;
  s2 = _mm_mullo_epi32(s7, sinpi3);

  u0 = _mm_add_epi32(s0, s3);
  u1 = _mm_add_epi32(s1, s3);
  u2 = s2;
  t = _mm_add_epi32(s0, s1);
  u3 = _mm_sub_epi32(t, s3);

  // u0
  u0_low = _mm_mul_epi32(u0, mul);
  u0_low = _mm_add_epi64(u0_low, rnding);

  u0 = _mm_srli_si128(u0, 4);
  u0_high = _mm_mul_epi32(u0, mul);
  u0_high = _mm_add_epi64(u0_high, rnding);

  u0_low = _mm_srli_si128(u0_low, 2);
  u0_high = _mm_srli_si128(u0_high, 2);

  u0 = _mm_unpacklo_epi32(u0_low, u0_high);
  u0_high = _mm_unpackhi_epi32(u0_low, u0_high);
  u0 = _mm_unpacklo_epi64(u0, u0_high);

  // u1
  u1_low = _mm_mul_epi32(u1, mul);
  u1_low = _mm_add_epi64(u1_low, rnding);

  u1 = _mm_srli_si128(u1, 4);
  u1_high = _mm_mul_epi32(u1, mul);
  u1_high = _mm_add_epi64(u1_high, rnding);

  u1_low = _mm_srli_si128(u1_low, 2);
  u1_high = _mm_srli_si128(u1_high, 2);

  u1 = _mm_unpacklo_epi32(u1_low, u1_high);
  u1_high = _mm_unpackhi_epi32(u1_low, u1_high);
  u1 = _mm_unpacklo_epi64(u1, u1_high);

  // u2
  u2_low = _mm_mul_epi32(u2, mul);
  u2_low = _mm_add_epi64(u2_low, rnding);

  u2 = _mm_srli_si128(u2, 4);
  u2_high = _mm_mul_epi32(u2, mul);
  u2_high = _mm_add_epi64(u2_high, rnding);

  u2_low = _mm_srli_si128(u2_low, 2);
  u2_high = _mm_srli_si128(u2_high, 2);

  u2 = _mm_unpacklo_epi32(u2_low, u2_high);
  u2_high = _mm_unpackhi_epi32(u2_low, u2_high);
  u2 = _mm_unpacklo_epi64(u2, u2_high);

  // u3
  u3_low = _mm_mul_epi32(u3, mul);
  u3_low = _mm_add_epi64(u3_low, rnding);

  u3 = _mm_srli_si128(u3, 4);
  u3_high = _mm_mul_epi32(u3, mul);
  u3_high = _mm_add_epi64(u3_high, rnding);

  u3_low = _mm_srli_si128(u3_low, 2);
  u3_high = _mm_srli_si128(u3_high, 2);

  u3 = _mm_unpacklo_epi32(u3_low, u3_high);
  u3_high = _mm_unpackhi_epi32(u3_low, u3_high);
  u3 = _mm_unpacklo_epi64(u3, u3_high);

  out[0] = u0;
  out[1] = u1;
  out[2] = u2;
  out[3] = u3;

  if (!do_cols) {
    const int log_range = AOMMAX(16, bd + 6);
    const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    round_shift_4x4(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo, &clamp_hi, 4);
  }
}